

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ManchesterSimulationDataGenerator::Initialize
          (ManchesterSimulationDataGenerator *this,U32 simulation_sample_rate,
          ManchesterAnalyzerSettings *settings)

{
  U64 UVar1;
  ulong uVar2;
  BitState BVar3;
  double dVar4;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mManchesterSimulationData);
  BVar3 = (BitState)&this->mManchesterSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar3);
  SimulationChannelDescriptor::SetInitialBitState(BVar3);
  dVar4 = ((double)this->mSimulationSampleRateHz *
          (1.0 / (double)(this->mSettings->mBitRate * 2)) * 1000000.0) / 1000000.0;
  uVar2 = (ulong)dVar4;
  this->mT = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  this->mSimValue = 1;
  UVar1 = 0xffffffff;
  if (this->mSettings->mBitsPerTransfer < 0x21) {
    UVar1 = 1;
  }
  this->mSimValue = UVar1;
  SimulationChannelDescriptor::Advance(BVar3);
  return;
}

Assistant:

void ManchesterSimulationDataGenerator::Initialize( U32 simulation_sample_rate, ManchesterAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mManchesterSimulationData.SetChannel( mSettings->mInputChannel );
    mManchesterSimulationData.SetSampleRate( simulation_sample_rate );

    mManchesterSimulationData.SetInitialBitState( BIT_LOW );

    double half_period = 1.0 / double( mSettings->mBitRate * 2 );
    half_period *= 1000000.0;
    mT = UsToSamples( half_period );
    mSimValue = 1;

    if( mSettings->mBitsPerTransfer > 32 )
    {
        mSimValue = 0xFFFFFFFF;
    }

    mManchesterSimulationData.Advance( U32( mT * 8 ) );
}